

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

int ref_singleton(saucy *s,coloring *c,int *adj,int *edg,int cf)

{
  int iVar1;
  int *piVar2;
  ulong uVar3;
  
  iVar1 = c->lab[cf];
  uVar3 = (ulong)adj[iVar1];
  piVar2 = edg + uVar3;
  for (; (int)uVar3 != adj[(long)iVar1 + 1]; uVar3 = (ulong)((int)uVar3 + 1)) {
    if (c->clen[c->cfront[*piVar2]] != 0) {
      move_to_back(s,c,*piVar2);
    }
    piVar2 = piVar2 + 1;
  }
  iVar1 = refine_cell(s,c,ref_single_cell);
  return iVar1;
}

Assistant:

static int
ref_singleton(struct saucy *s, struct coloring *c,
    const int *adj, const int *edg, int cf)
{
    int i, k = c->lab[cf];

    /* Find the cells we're connected to, and mark our neighbors */
    for (i = adj[k]; i != adj[k+1]; ++i) {
        data_mark(s, c, edg[i]);
    }

    /* Refine the cells we're connected to */
    return refine_cell(s, c, ref_single_cell);
}